

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxWriterDOTFormat.cpp
# Opt level: O2

void __thiscall psy::C::SyntaxWriterDOTFormat::generateTokens(SyntaxWriterDOTFormat *this)

{
  SyntaxWriterDOTFormat *pSVar1;
  SyntaxToken *pSVar2;
  uint token;
  uint token_00;
  string t;
  value_type local_70;
  string local_50;
  SyntaxWriterDOTFormat *tkIdx;
  
  token = 0;
  while( true ) {
    token_00 = token + 1;
    tkIdx = (SyntaxWriterDOTFormat *)(ulong)token_00;
    pSVar1 = (SyntaxWriterDOTFormat *)
             SyntaxTree::tokenCount((this->super_SyntaxDumper).super_SyntaxVisitor.tree_);
    if (pSVar1 <= tkIdx) {
      return;
    }
    pSVar1 = tkIdx;
    pSVar2 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                 (IndexType)tkIdx);
    if (pSVar2->syntaxK_ == EndOfFile) break;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    terminalId_abi_cxx11_(&local_50,pSVar1,token_00);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)&local_70);
    pSVar2 = SyntaxTree::tokenAt((this->super_SyntaxDumper).super_SyntaxVisitor.tree_,
                                 (IndexType)tkIdx);
    SyntaxToken::valueText_abi_cxx11_(&local_50,pSVar2);
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::append((char *)&local_70);
    if (1 < token_00) {
      pSVar1 = (SyntaxWriterDOTFormat *)0x40fcc6;
      std::__cxx11::string::append((char *)&local_70);
      terminalId_abi_cxx11_(&local_50,pSVar1,token);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      pSVar1 = (SyntaxWriterDOTFormat *)0x40f415;
      std::__cxx11::string::append((char *)&local_70);
      terminalId_abi_cxx11_(&local_50,pSVar1,token_00);
      std::__cxx11::string::append((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::append((char *)&local_70);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->terminalShapes_,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    token = token_00;
  }
  return;
}

Assistant:

void SyntaxWriterDOTFormat::generateTokens() {
    for (unsigned token = 1; token < tree_->tokenCount(); ++token) {
        if (tree_->tokenAt(token).kind() == SyntaxKind::EndOfFile)
            break;

        std::string t;
        t.append(terminalId(token));
        t.append(" [shape=rect label = \"");
        t.append(tree_->tokenAt(token).valueText());
        t.append("\"]");

        if (token > 1) {
            t.append("; ");
            t.append(terminalId(token - 1));
            t.append(" -> ");
            t.append(terminalId(token));
            t.append(" [arrowhead=\"vee\" color=\"transparent\"]");
        }

        terminalShapes_.push_back(t);
    }
}